

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clientversion.cpp
# Opt level: O0

string * LicenseInfo_abi_cxx11_(void)

{
  string *in_RDI;
  long in_FS_OFFSET;
  string URL_SOURCE_CODE;
  bilingual_str *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  char *fmt;
  int *in_stack_fffffffffffffc60;
  char *__lhs_00;
  allocator<char> *in_stack_fffffffffffffc68;
  char *fmt_00;
  char *in_stack_fffffffffffffc70;
  ConstevalStringLiteral in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_369 [27];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = local_369;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc78.lit,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::allocator<char>::~allocator((allocator<char> *)local_369);
  fmt_00 = "Copyright (C) %i-%i";
  _(in_stack_fffffffffffffc78);
  tinyformat::format<int,int>
            ((string *)fmt_00,in_stack_fffffffffffffc60,(int *)in_stack_fffffffffffffc58);
  std::operator+(__lhs,(char *)in_RDI);
  CopyrightHolders(in_stack_fffffffffffffc50);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  __lhs_00 = 
  "Please contribute if you find %s useful. Visit %s for further information about the software.";
  _(in_stack_fffffffffffffc78);
  tinyformat::format<char[13],char[27]>
            ((string *)fmt_00,(char (*) [13])__lhs_00,(char (*) [27])in_stack_fffffffffffffc58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs_00,
                 in_stack_fffffffffffffc58);
  std::operator+(__lhs,(char *)in_RDI);
  fmt = "The source code is available from %s.";
  _(in_stack_fffffffffffffc78);
  tinyformat::format<std::__cxx11::string>((string *)fmt,in_stack_fffffffffffffc50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  _(in_stack_fffffffffffffc78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt);
  std::operator+(__lhs,(char *)in_RDI);
  _(in_stack_fffffffffffffc78);
  tinyformat::format<char[8],char[38]>((string *)fmt_00,(char (*) [8])__lhs_00,(char (*) [38])fmt);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  bilingual_str::~bilingual_str(in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(&in_stack_fffffffffffffc28->original);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string LicenseInfo()
{
    const std::string URL_SOURCE_CODE = "<https://github.com/bitcoin/bitcoin>";

    return CopyrightHolders(strprintf(_("Copyright (C) %i-%i").translated, 2009, COPYRIGHT_YEAR) + " ") + "\n" +
           "\n" +
           strprintf(_("Please contribute if you find %s useful. "
                       "Visit %s for further information about the software.").translated, PACKAGE_NAME, "<" PACKAGE_URL ">") +
           "\n" +
           strprintf(_("The source code is available from %s.").translated, URL_SOURCE_CODE) +
           "\n" +
           "\n" +
           _("This is experimental software.").translated + "\n" +
           strprintf(_("Distributed under the MIT software license, see the accompanying file %s or %s").translated, "COPYING", "<https://opensource.org/licenses/MIT>") +
           "\n";
}